

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_open_memory.c
# Opt level: O0

void test_write_open_memory(void)

{
  size_t v1;
  int iVar1;
  char *v1_00;
  la_int64_t lVar2;
  la_int64_t v2;
  size_t blocksize;
  size_t used;
  char *name;
  archive_entry *ae;
  archive *a;
  uint i;
  
  used = (size_t)anon_var_dwarf_530f8;
  name = (char *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_open_memory.c"
                   ,L'&',(uint)((archive_entry *)name != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_pathname((archive_entry *)name,(char *)used);
  archive_entry_set_mode((archive_entry *)name,0x8000);
  v1_00 = archive_entry_pathname((archive_entry *)name);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_open_memory.c"
             ,L')',v1_00,"archive_entry_pathname(ae)",(char *)used,"name",(void *)0x0,L'\0');
  for (a._4_4_ = 100; a._4_4_ < 0x640; a._4_4_ = a._4_4_ + 1) {
    ae = (archive_entry *)archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_open_memory.c"
                     ,L'1',(uint)(ae != (archive_entry *)0x0),"(a = archive_write_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_write_set_format_ustar((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_open_memory.c"
                        ,L'3',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",ae);
    iVar1 = archive_write_set_bytes_in_last_block((archive *)ae,1);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_open_memory.c"
                        ,L'5',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_set_bytes_in_last_block(a, 1)",ae);
    iVar1 = archive_write_set_bytes_per_block((archive *)ae,0x5e);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_open_memory.c"
                        ,L'7',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_set_bytes_per_block(a, (int)blocksize)",ae);
    buff[a._4_4_] = 0xae;
    iVar1 = archive_write_open_memory((archive *)ae,buff,(ulong)a._4_4_,&blocksize);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_open_memory.c"
                        ,L':',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_open_memory(a, buff, i, &used)",ae);
    if ((ulong)a._4_4_ <
        (ulong)(SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1ff)) / ZEXT816(0x5e),0) * 0x5e)) {
      iVar1 = archive_write_header((archive *)ae,(archive_entry *)name);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_open_memory.c"
                          ,L'>',-0x1e,"ARCHIVE_FATAL",(long)iVar1,"archive_write_header(a,ae)",ae);
    }
    else {
      iVar1 = archive_write_header((archive *)ae,(archive_entry *)name);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_open_memory.c"
                          ,L'A',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",ae);
    }
    failure("buffer size=%d\n",(ulong)a._4_4_);
    if (a._4_4_ < 0x600) {
      iVar1 = archive_write_close((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_open_memory.c"
                          ,L'G',-0x1e,"ARCHIVE_FATAL",(long)iVar1,"archive_write_close(a)",ae);
    }
    else {
      iVar1 = archive_write_close((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_open_memory.c"
                          ,L'I',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",ae);
      v1 = blocksize;
      lVar2 = archive_filter_bytes((archive *)ae,-1);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_open_memory.c"
                          ,L'J',v1,"used",lVar2,"archive_filter_bytes(a, -1)",(void *)0x0);
      lVar2 = archive_filter_bytes((archive *)ae,-1);
      v2 = archive_filter_bytes((archive *)ae,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_open_memory.c"
                          ,L'L',lVar2,"archive_filter_bytes(a, -1)",v2,"archive_filter_bytes(a, 0)",
                          (void *)0x0);
    }
    iVar1 = archive_write_free((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_open_memory.c"
                        ,L'N',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_open_memory.c"
                        ,L'O',(ulong)buff[a._4_4_],"buff[i]",0xae,"0xAE",(void *)0x0);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_open_memory.c"
                     ,L'P',(uint)(blocksize <= a._4_4_),"used <= i",(void *)0x0);
  }
  archive_entry_free((archive_entry *)name);
  return;
}

Assistant:

DEFINE_TEST(test_write_open_memory)
{
	unsigned int i;
	struct archive *a;
	struct archive_entry *ae;
	const char *name="/tmp/test";

	/* Create a simple archive_entry. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_pathname(ae, name);
	archive_entry_set_mode(ae, S_IFREG);
	assertEqualString(archive_entry_pathname(ae), name);

	/* Try writing with different buffer sizes. */
	/* Make sure that we get failure on too-small buffers, success on
	 * large enough ones. */
	for (i = 100; i < 1600; i++) {
		size_t used;
		size_t blocksize = 94;
		assert((a = archive_write_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_set_format_ustar(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_set_bytes_in_last_block(a, 1));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_set_bytes_per_block(a, (int)blocksize));
		buff[i] = 0xAE;
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_open_memory(a, buff, i, &used));
		/* If buffer is smaller than a tar header, this should fail. */
		if (i < (511/blocksize)*blocksize)
			assertEqualIntA(a, ARCHIVE_FATAL,
			    archive_write_header(a,ae));
		else
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_write_header(a, ae));
		/* If buffer is smaller than a tar header plus 1024 byte
		 * end-of-archive marker, then this should fail. */
		failure("buffer size=%d\n", (int)i);
		if (i < 1536)
			assertEqualIntA(a, ARCHIVE_FATAL,
			    archive_write_close(a));
		else {
			assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
			assertEqualInt(used, archive_filter_bytes(a, -1));
			assertEqualInt(archive_filter_bytes(a, -1),
			    archive_filter_bytes(a, 0));
		}
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		assertEqualInt(buff[i], 0xAE);
		assert(used <= i);
	}
	archive_entry_free(ae);
}